

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserDeleteView.cpp
# Opt level: O3

void __thiscall UserDeleteView::display(UserDeleteView *this)

{
  display((UserDeleteView *)&this[-1].super_DeleteView<BaseUser>.super_View.menuChoices);
  return;
}

Assistant:

void UserDeleteView::display() {
    cout << "Enter the email of user to delete: ";
    string email;
    email = Input::getEmail();
    BaseUser *user = BaseUser::findByEmail(email);
    if (!user) {
        cout << "No user with this email exists.\n";
    }
    else if (Application::getInstance().getCurrentUser()->getEmail() == email)
        cout << "You cannot delete yourself!" << endl;
    else {
        context.requestObjectId = user->getId();
        DeleteView::display();
    }
    response->view = Controller::getInstance().getView("admin-panel");
}